

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void math1Func(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  double val;
  
  iVar1 = sqlite3_value_numeric_type(*argv);
  if (iVar1 - 3U < 0xfffffffe) {
    return;
  }
  sqlite3VdbeRealValue(*argv);
  val = (double)(*(code *)context->pFunc->pUserData)();
  sqlite3VdbeMemSetDouble(context->pOut,val);
  return;
}

Assistant:

static void math1Func(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int type0;
  double v0, ans;
  double (*x)(double);
  assert( argc==1 );
  type0 = sqlite3_value_numeric_type(argv[0]);
  if( type0!=SQLITE_INTEGER && type0!=SQLITE_FLOAT ) return;
  v0 = sqlite3_value_double(argv[0]);
  x = (double(*)(double))sqlite3_user_data(context);
  ans = x(v0);
  sqlite3_result_double(context, ans);
}